

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

IVec2 __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::getOffsetRange(TextureGatherCase *this)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  long in_RSI;
  
  iVar2 = *(int *)(in_RSI + 0x7c);
  iVar3 = iVar2;
  if (iVar2 != 0) {
    if (iVar2 == 2) {
      plVar1 = *(long **)(*(long *)(in_RSI + 0x70) + 0x10);
      iVar2 = (**(code **)(*plVar1 + 0x10))(plVar1,0x8e5e);
      plVar1 = *(long **)(*(long *)(in_RSI + 0x70) + 0x10);
      iVar3 = (**(code **)(*plVar1 + 0x10))(plVar1,0x8e5f);
    }
    else if (iVar2 == 1) {
      iVar2 = -8;
      iVar3 = 7;
    }
    else {
      iVar2 = -1;
      iVar3 = iVar2;
    }
  }
  *(int *)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = iVar2;
  *(int *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar3;
  return (IVec2)(int  [2])this;
}

Assistant:

IVec2 TextureGatherCase::getOffsetRange (void) const
{
	switch (m_offsetSize)
	{
		case OFFSETSIZE_NONE:
			return IVec2(0);
			break;

		case OFFSETSIZE_MINIMUM_REQUIRED:
			// \note Defined by spec.
			return IVec2(SPEC_MAX_MIN_OFFSET,
						 SPEC_MIN_MAX_OFFSET);
			break;

		case OFFSETSIZE_IMPLEMENTATION_MAXIMUM:
			return IVec2(m_context.getContextInfo().getInt(GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET),
						 m_context.getContextInfo().getInt(GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET));
			break;

		default:
			DE_ASSERT(false);
			return IVec2(-1);
	}
}